

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O3

void GetOpt::_Option::setTokenAsUsed(Token *token,ShortOptions *short_ops,Type usedAs)

{
  pair<std::_Rb_tree_iterator<std::pair<const_char,_GetOpt::OptionData>_>,_std::_Rb_tree_iterator<std::pair<const_char,_GetOpt::OptionData>_>_>
  pVar1;
  
  if (token->type == PossibleNegativeArgument) {
    pVar1 = std::
            _Rb_tree<char,_std::pair<const_char,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_char,_GetOpt::OptionData>_>,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
            ::equal_range(&short_ops->_M_t,(token->value)._M_dataplus._M_p + 1);
    std::
    _Rb_tree<char,_std::pair<const_char,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_char,_GetOpt::OptionData>_>,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
    ::_M_erase_aux(&short_ops->_M_t,(_Base_ptr)pVar1.first._M_node,(_Base_ptr)pVar1.second._M_node);
  }
  token->type = usedAs;
  return;
}

Assistant:

static void setTokenAsUsed(Token* token, ShortOptions& short_ops, Token::Type usedAs)
    {
        if (token->type == Token::PossibleNegativeArgument)
            short_ops.erase(token->value[1]);

        token->type = usedAs;
    }